

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testGroupStarting
          (StreamingReporterBase<Catch::CompactReporter> *this,GroupInfo *_groupInfo)

{
  LazyStat<Catch::GroupInfo> *in_RSI;
  GroupInfo *in_stack_ffffffffffffffe8;
  
  LazyStat<Catch::GroupInfo>::operator=(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void testGroupStarting(GroupInfo const& _groupInfo) override {
            currentGroupInfo = _groupInfo;
        }